

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

void __thiscall verona::Options::configure(Options *this,App *cli)

{
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"--no-std","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Don\'t import the standard library.","");
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>(cli,&local_40,&this->no_std,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Options::configure(CLI::App& cli)
  {
    cli.add_flag("--no-std", no_std, "Don't import the standard library.");
  }